

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockMgr::GetLockControllerForFile
          (CSharedMemoryFileLockMgr *this,CPalThread *pThread,LPCSTR szFileName,DWORD dwAccessRights
          ,DWORD dwShareMode,IFileLockController **ppLockController)

{
  SHMPTR arg2;
  PAL_ERROR PVar1;
  LPVOID pvVar2;
  CSharedMemoryFileLockController *pCVar3;
  uint uVar4;
  uint uVar5;
  SHMPTR local_48;
  IFileLockController **local_40;
  LPVOID local_38;
  
  local_48 = 0;
  SHMLock();
  PVar1 = FILEGetSHMFileLocks(szFileName,&local_48,0);
  arg2 = local_48;
  if (PVar1 == 0) {
    local_40 = ppLockController;
    if ((local_48 == 0) || (pvVar2 = SHMPtrToPtr(local_48), pvVar2 == (LPVOID)0x0)) {
      fprintf(_stderr,"] %s %s:%d","GetLockControllerForFile",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x78);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      PVar1 = 0x54f;
      goto LAB_003253ad;
    }
    uVar5 = *(uint *)((long)pvVar2 + 0x28);
    PVar1 = 0x20;
    if (uVar5 != 0) {
      if (uVar5 == 0xffffffff) {
        *(DWORD *)((long)pvVar2 + 0x28) = dwShareMode;
        uVar5 = dwShareMode;
      }
      else {
        if ((((int)dwAccessRights < 0) && ((uVar5 & 1) == 0)) ||
           ((uVar4 = uVar5 & 2, (dwAccessRights >> 0x1e & 1) != 0 && (uVar4 == 0))))
        goto LAB_003253b2;
        if ((dwShareMode & 3) == 1) {
          uVar4 = uVar5 & 1;
joined_r0x00325416:
          if (uVar4 == 0) goto LAB_003253b2;
        }
        else if ((dwShareMode & 3) == 2) goto joined_r0x00325416;
        if ((((dwShareMode & 1) == 0) && (*(int *)((long)pvVar2 + 0x2c) != 0)) ||
           (((dwShareMode & 2) == 0 && (*(int *)((long)pvVar2 + 0x30) != 0)))) goto LAB_003253b2;
      }
      local_38 = pvVar2;
      pCVar3 = InternalNew<CorUnix::CSharedMemoryFileLockController,unsigned_int,unsigned_long>
                         (dwAccessRights,arg2);
      if (pCVar3 != (CSharedMemoryFileLockController *)0x0) {
        uVar4 = dwShareMode;
        if ((uVar5 & 1) == 0) {
          uVar4 = uVar5;
        }
        if ((dwShareMode & 1) == 0) {
          uVar4 = dwShareMode;
        }
        if ((uVar5 & 2) != 0) {
          uVar5 = uVar4;
        }
        if ((uVar4 & 2) == 0) {
          uVar5 = uVar4;
        }
        *(uint *)((long)local_38 + 0x28) = uVar5;
        if ((int)dwAccessRights < 0) {
          *(int *)((long)local_38 + 0x2c) = *(int *)((long)local_38 + 0x2c) + 1;
        }
        if ((dwAccessRights >> 0x1e & 1) != 0) {
          *(int *)((long)local_38 + 0x30) = *(int *)((long)local_38 + 0x30) + 1;
        }
        *local_40 = &pCVar3->super_IFileLockController;
        PVar1 = 0;
        goto LAB_003253be;
      }
      PVar1 = 0xe;
    }
  }
  else {
LAB_003253ad:
    if (arg2 == 0) goto LAB_003253be;
  }
LAB_003253b2:
  FILECleanUpLockedRgn(arg2,0,(PVOID)0x0);
LAB_003253be:
  SHMRelease();
  return PVar1;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockMgr::GetLockControllerForFile(
    CPalThread *pThread,                // IN, OPTIONAL
    LPCSTR szFileName,
    DWORD dwAccessRights,
    DWORD dwShareMode,
    IFileLockController **ppLockController  // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMPTR shmFileLocks = SHMNULL;
    SHMFILELOCKS* fileLocks = NULL;
    CSharedMemoryFileLockController *pController = NULL;

    SHMLock();

    palError = FILEGetSHMFileLocks(szFileName, &shmFileLocks, FALSE);
    if (NO_ERROR != palError)
    {
        goto GetLockControllerForFileExit;
    }

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE || fileLocks == NULL)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto GetLockControllerForFileExit;
    }
        
    if(SHARE_MODE_NOT_INITALIZED == fileLocks->share_mode)
    {
        /* this is the first time this file is open */
        fileLocks->share_mode = (int) dwShareMode;
    }
    /* start checking for dwDesired access and dwShareMode conditions */
    else if(0 == fileLocks->share_mode)
    {
        /* file is exclusively locked */
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;
    }
    /* check for if the desired access is allowed by the share mode */
    else if( (dwAccessRights & GENERIC_READ) && 
             !(fileLocks->share_mode & FILE_SHARE_READ) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    else if( (dwAccessRights & GENERIC_WRITE) && 
             !(fileLocks->share_mode & FILE_SHARE_WRITE) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    /* The case when changing to a conflicting share mode is particular.
       The general rule is: changing from conflicting share mode is invalid
       (i.e changing from FILE_SHARE_WRITE to FILE_SHARE_READ is invalid).
       However, if one of the share flags is the same
       (i.e changing from FILE_SHARE_WRITE to FILE_SHARE_READ | FILE_SHARE_WRITE)
       the result is valid. (Please note that FILE_SHARE_READ is ignored
       in this case).
    */
    else if( (dwShareMode & FILE_SHARE_READ) && 
             !(dwShareMode & FILE_SHARE_WRITE) &&
             !(fileLocks->share_mode & FILE_SHARE_READ))
                         
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    else if( (dwShareMode & FILE_SHARE_WRITE) && 
             !(dwShareMode & FILE_SHARE_READ) &&
             !(fileLocks->share_mode & FILE_SHARE_WRITE))
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    /* Changing to a less permissive sharing permissions is valid
       if the file handle doesn't have an access right that conflicts with
       the sharing permissions we are trying to set
       (ex: changing from FILE_SHARE_READ|FILE_SHARE_WRITE to FILE_SHARE_WRITE
       isn't valid if the file descriptor still has a GENERIC_READ permission).
    */     
    else if( (fileLocks->nbReadAccess) && 
             !(dwShareMode & FILE_SHARE_READ) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }
    else if( (fileLocks->nbWriteAccess) && 
             !(dwShareMode & FILE_SHARE_WRITE) )
    {
        palError = ERROR_SHARING_VIOLATION;
        goto GetLockControllerForFileExit;     
    }

    /* we are trying to change to a less restrictive sharing permission set 
       keep the current permissions */  
    if( (dwShareMode & FILE_SHARE_READ) && 
              !(fileLocks->share_mode & FILE_SHARE_READ) )
    {
        dwShareMode = fileLocks->share_mode;
    }

    if( (dwShareMode & FILE_SHARE_WRITE) && 
              !(fileLocks->share_mode & FILE_SHARE_WRITE) )
    {
        dwShareMode = fileLocks->share_mode;
    }

    pController = InternalNew<CSharedMemoryFileLockController>(dwAccessRights, shmFileLocks);
    if (NULL == pController)
    {
        palError = ERROR_OUTOFMEMORY;
        goto GetLockControllerForFileExit;
    }

    //
    // pController now owns the shared memory pointer, so make sure we
    // don't attempt to free it below.
    //

    shmFileLocks = SHMNULL;

    /* set the share mode again, it's possible that the share mode is now more
    restrictive than the previous mode set. */
    fileLocks->share_mode = dwShareMode;
    if( dwAccessRights & GENERIC_READ )
    {
        fileLocks->nbReadAccess++;  
    }
    if( dwAccessRights & GENERIC_WRITE )
    {
        fileLocks->nbWriteAccess++;
    }

    // ************** NOTE **************
    // If you add any error paths after this point you must communicate the value of dwAccessRights to
    // FILECleanUpLockedRgn() in the cleanup code below so that it can correctly undo the changes to
    // fileLocks->nbReadAccess and nbWriteAccess made above.
    // ************** NOTE **************

GetLockControllerForFileExit:

    if (NO_ERROR == palError)
    {
        *ppLockController = pController;
    }
    else
    {
        if (NULL != pController)
        {
            pController->ReleaseController();
        }

        if (SHMNULL != shmFileLocks)
        {
            FILECleanUpLockedRgn(
                shmFileLocks,
                0,
                NULL
                );
        }
    }

    SHMRelease();

    return palError;
}